

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visual_debugger.cpp
# Opt level: O0

void __thiscall
CGL::VisualDebugger::VisualDebugger(VisualDebugger *this,Scene **parent_scene,int *current_mode)

{
  int *current_mode_local;
  Scene **parent_scene_local;
  VisualDebugger *this_local;
  
  this->running = true;
  return;
}

Assistant:

VisualDebugger::VisualDebugger(GLScene::Scene** parent_scene, int* current_mode)
  {
#ifdef ENABLE_VISUAL_DEBUGGER
    this->parent_scene = parent_scene;
    this->current_mode = current_mode;

    this->window_parent = glfwGetCurrentContext();

    // Setup window
    window = glfwCreateWindow(800, 600, "Visual Debugger", NULL, NULL);
    if (window == NULL) return;
    glfwMakeContextCurrent(window);
    glfwSwapInterval(1); // Enable vsync

    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableKeyboard;     // Enable Keyboard Controls
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableGamepad;      // Enable Gamepad Controls

    // Setup Dear ImGui style
    ImGui::StyleColorsDark();
    //ImGui::StyleColorsClassic();

    // Setup Platform/Renderer backends
    ImGui_ImplGlfw_InitForOpenGL(window, true);
    ImGui_ImplOpenGL2_Init();
  
    glfwMakeContextCurrent(window_parent);
#endif
  }